

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-bcon-extract.c
# Opt level: O1

void test_inline_doc(void)

{
  char cVar1;
  char extraout_AL;
  int iVar2;
  uint uVar3;
  uint __fd;
  int iVar4;
  undefined8 in_RAX;
  undefined8 uVar5;
  bson_t *bson;
  char *pcVar6;
  char *__buf;
  char *__n;
  void *pvVar7;
  void *__s2;
  char *pcVar8;
  char *pcVar9;
  size_t sVar10;
  size_t sVar11;
  DIR *__dirp;
  dirent *pdVar12;
  FILE *__stream;
  long lVar13;
  undefined8 uVar14;
  uint extraout_EDX;
  ulong uVar15;
  char *__dest;
  char *pcVar16;
  ulong uVar17;
  DIR *__s;
  DIR *__name;
  char *pcVar18;
  DIR *pDVar19;
  DIR *__filename;
  undefined8 uVar20;
  DIR *pDVar21;
  char *pcVar22;
  char *__n_00;
  undefined8 extraout_XMM1_Qa;
  undefined8 extraout_XMM1_Qa_00;
  undefined8 extraout_XMM1_Qa_01;
  undefined8 extraout_XMM1_Qa_02;
  undefined1 auStack_6e98 [8];
  undefined1 auStack_6e90 [504];
  ulong uStack_6c98;
  DIR *pDStack_6c90;
  char *pcStack_6c88;
  DIR *pDStack_6c80;
  DIR *pDStack_6c78;
  int iStack_6c6c;
  DIR *pDStack_6c68;
  stat sStack_6c60;
  char acStack_6bd0 [512];
  size_t sStack_69d0;
  char *pcStack_69c8;
  DIR *pDStack_69c0;
  char *pcStack_69b8;
  code *pcStack_69b0;
  char *pcStack_69a8;
  ulong uStack_69a0;
  char *pcStack_6998;
  DIR *pDStack_6990;
  undefined8 *puStack_6988;
  undefined8 uStack_6950;
  undefined1 *puStack_6948;
  undefined1 *puStack_6940;
  undefined1 auStack_6930 [8];
  char *pcStack_6928;
  undefined8 uStack_6918;
  char *pcStack_6910;
  undefined8 uStack_6908;
  undefined8 uStack_68f0;
  DIR aDStack_6880 [25944];
  char *pcStack_328;
  char *pcStack_320;
  char *pcStack_318;
  char *pcStack_310;
  code *apcStack_308 [2];
  undefined1 auStack_2f8 [116];
  uint uStack_284;
  char acStack_280 [312];
  undefined8 uStack_148;
  char *pcStack_140;
  char *pcStack_138;
  char *pcStack_130;
  char *pcStack_128;
  char *pcStack_120;
  char *pcStack_118;
  undefined8 uStack_110;
  code *pcStack_108;
  char *pcStack_100;
  undefined8 uStack_f8;
  char *pcStack_f0;
  char *pcStack_e8;
  char *pcStack_e0;
  char *pcStack_d8;
  code *pcStack_d0;
  undefined8 uStack_c8;
  undefined8 uStack_c0;
  char *pcStack_b8;
  char *pcStack_b0;
  char *pcStack_a8;
  undefined8 uStack_a0;
  bson_t *pbStack_98;
  char *pcStack_90;
  code *pcStack_88;
  undefined8 uStack_80;
  undefined8 uStack_78;
  undefined8 uStack_70;
  char *pcStack_68;
  char *pcStack_60;
  char *pcStack_58;
  char *pcStack_50;
  char *pcStack_48;
  code *pcStack_40;
  int32_t b;
  int32_t a;
  
  pcStack_40 = (code *)0x13c4cc;
  _b = in_RAX;
  pcStack_68 = (char *)bson_bcon_magic();
  pcStack_48 = (char *)0x0;
  pcStack_50 = "}";
  pcStack_58 = (char *)0x1;
  pcStack_60 = (char *)0xf;
  uStack_70 = "a";
  uStack_78 = (int32_t *)0x2;
  uStack_80 = 0x13c51f;
  uVar5 = bcon_new(0,"foo","{","b",pcStack_68,0xf);
  pcStack_40 = (code *)0x13c52b;
  pcStack_68 = (char *)bson_bcone_magic();
  uStack_78 = &a;
  pcStack_48 = (char *)0x0;
  pcStack_50 = "}";
  pcStack_60 = (char *)0xf;
  uStack_70 = "b";
  uStack_80 = 0x13c56e;
  pcStack_58 = (char *)&b;
  cVar1 = bcon_extract(uVar5,"foo","{","a",pcStack_68,0xf);
  if (cVar1 == '\0') {
    pcStack_40 = (code *)0x13c59f;
    test_inline_doc_cold_1();
LAB_0013c59f:
    pcStack_40 = (code *)0x13c5a4;
    test_inline_doc_cold_2();
  }
  else {
    if (a != 1) goto LAB_0013c59f;
    if (b == 2) {
      pcStack_40 = (code *)0x13c58b;
      bson_destroy(uVar5);
      return;
    }
  }
  pcStack_40 = test_extract_ctx;
  test_inline_doc_cold_3();
  pcStack_40 = (code *)0x0;
  pcStack_48 = "a";
  pcStack_58 = "{";
  pcStack_60 = "foo";
  pcStack_68 = "}";
  pcStack_88 = (code *)0x13c5bc;
  pcStack_50 = (char *)uVar5;
  uStack_c0 = (undefined8 *)bson_bcon_magic();
  pcStack_88 = (code *)0x0;
  pcStack_90 = (char *)0x3;
  pbStack_98 = (bson_t *)0xf;
  pcStack_a8 = "c";
  pcStack_b0 = (char *)0x2;
  pcStack_b8 = (char *)0xf;
  uStack_c8 = 0x13c5fe;
  uStack_a0 = uStack_c0;
  bson = (bson_t *)bcon_new(0,"a",uStack_c0,0xf,1,"b");
  pcStack_88 = (code *)0x13c60a;
  pcStack_d0 = (code *)bson_bcone_magic();
  pbStack_98 = (bson_t *)((long)&uStack_78 + 4);
  uStack_c0 = &uStack_70;
  pcStack_90 = (char *)0x0;
  uStack_a0 = 0xf;
  pcStack_b0 = "c";
  pcStack_b8 = (char *)0x0;
  uStack_c8 = 0xf;
  pcStack_d8 = "b";
  pcStack_e0 = (char *)0x0;
  pcStack_e8 = (char *)0x13c656;
  pcStack_a8 = (char *)pcStack_d0;
  test_extract_ctx_helper(bson,3,"a",pcStack_d0,0xf,(long)&uStack_70 + 4);
  if (uStack_70._4_4_ == 1) {
    if ((int)uStack_70 != 2) goto LAB_0013c68b;
    if (uStack_78._4_4_ == 3) {
      pcStack_88 = (code *)0x13c677;
      bson_destroy(bson);
      return;
    }
  }
  else {
    pcStack_88 = (code *)0x13c68b;
    test_extract_ctx_cold_1();
LAB_0013c68b:
    pcStack_88 = (code *)0x13c690;
    test_extract_ctx_cold_2();
  }
  pcStack_88 = test_nested;
  test_extract_ctx_cold_3();
  pcStack_88 = (code *)0xf;
  pcStack_90 = "a";
  uStack_a0 = 0;
  pcStack_b0 = "c";
  pcStack_d0 = (code *)0x13c6a8;
  pcStack_a8 = (char *)((long)&uStack_70 + 4);
  pbStack_98 = bson;
  uStack_f8 = bson_bcon_magic();
  pcStack_d8 = (char *)0x0;
  pcStack_e0 = "}";
  pcStack_e8 = (char *)0xa;
  pcStack_f0 = (char *)0xf;
  pcStack_100 = (char *)0x13c6fd;
  uVar5 = bcon_new(0,"hello","world","foo","{","bar");
  pcStack_d0 = (code *)0x13c709;
  uStack_f8 = bson_bcone_magic();
  pcStack_e8 = (char *)((long)&uStack_c0 + 4);
  pcStack_d8 = (char *)0x0;
  pcStack_e0 = "}";
  pcStack_f0 = (char *)0xf;
  pcStack_100 = "bar";
  pcStack_108 = (code *)0x13f9a8;
  uStack_110 = 0x13c745;
  cVar1 = bcon_extract(uVar5,"hello",uStack_f8,0,&pcStack_b8,"foo");
  if (cVar1 == '\0') {
    pcStack_d0 = (code *)0x13c785;
    test_nested_cold_1();
LAB_0013c785:
    pcStack_d0 = (code *)0x13c78a;
    test_nested_cold_2();
  }
  else {
    pcStack_d0 = (code *)0x13c75e;
    iVar2 = strcmp("world",pcStack_b8);
    if (iVar2 != 0) goto LAB_0013c785;
    if (uStack_c0._4_4_ == 10) {
      pcStack_d0 = (code *)0x13c771;
      bson_destroy(uVar5);
      return;
    }
  }
  pcStack_d0 = test_skip;
  test_nested_cold_3();
  pcStack_d0 = (code *)0x148ce7;
  pcStack_d8 = "bar";
  pcStack_e0 = (char *)0x0;
  pcStack_e8 = "hello";
  pcStack_f0 = "foo";
  pcStack_108 = (code *)0x13c79f;
  uStack_f8 = uVar5;
  pcStack_130 = (char *)bson_bcon_magic();
  uStack_110 = 0;
  pcStack_118 = "}";
  pcStack_120 = (char *)0xa;
  pcStack_128 = (char *)0xf;
  pcStack_138 = (char *)0x13c7f2;
  uVar5 = bcon_new(0,"hello","world","foo","{","bar");
  pcStack_108 = (code *)0x13c7fe;
  pcVar6 = (char *)bson_bcone_magic();
  pcVar22 = "}";
  uStack_110 = 0;
  pcStack_118 = "}";
  pcStack_120 = (char *)0x10;
  pcStack_128 = (char *)0x1c;
  pcStack_138 = "bar";
  pcStack_140 = "{";
  uStack_148 = 0x13c83a;
  pcStack_130 = pcVar6;
  cVar1 = bcon_extract(uVar5,"hello",pcVar6,0x1c,2);
  if (cVar1 == '\0') {
    pcStack_108 = (code *)0x13c89c;
    test_skip_cold_1();
  }
  else {
    uStack_110 = 0;
    pcStack_118 = "}";
    pcStack_120 = (char *)0x12;
    pcStack_128 = (char *)0x1c;
    pcStack_138 = "bar";
    pcStack_140 = "{";
    uStack_148 = 0x13c879;
    pcStack_130 = pcVar6;
    cVar1 = bcon_extract(uVar5,"hello",pcVar6,0x1c,2);
    if (cVar1 == '\0') {
      bson_destroy(uVar5);
      return;
    }
  }
  pcStack_108 = test_iter;
  test_skip_cold_2();
  pcStack_108 = (code *)0x14c89e;
  pcStack_118 = "bar";
  pcStack_120 = "}";
  pcStack_130 = "{";
  apcStack_308[0] = (code *)0x13c8be;
  pcStack_128 = pcVar6;
  uStack_110 = uVar5;
  __buf = (char *)bson_bcon_magic();
  __n_00 = "foo";
  apcStack_308[0] = (code *)0x13c8e5;
  __n = (char *)bcon_new(0,"foo",__buf,0xf,10);
  apcStack_308[0] = (code *)0x13c8ed;
  uVar5 = bson_bcone_magic();
  pcVar8 = acStack_280;
  pcVar16 = "foo";
  uVar14 = 0x1d;
  uVar20 = 0;
  apcStack_308[0] = (code *)0x13c90d;
  pcVar18 = __n;
  cVar1 = bcon_extract(__n,"foo",uVar5);
  uVar5 = extraout_XMM1_Qa;
  if (cVar1 == '\0') {
LAB_0013cabc:
    apcStack_308[0] = (code *)0x13cac1;
    test_iter_cold_1();
LAB_0013cac1:
    apcStack_308[0] = (code *)0x13cac6;
    test_iter_cold_2();
LAB_0013cac6:
    apcStack_308[0] = (code *)0x13cacb;
    test_iter_cold_3();
LAB_0013cacb:
    apcStack_308[0] = (code *)0x13cad0;
    test_iter_cold_8();
LAB_0013cad0:
    apcStack_308[0] = (code *)0x13cad5;
    test_iter_cold_7();
  }
  else {
    pcVar18 = acStack_280;
    apcStack_308[0] = (code *)0x13c922;
    iVar2 = bson_iter_type();
    uVar5 = extraout_XMM1_Qa_00;
    if (iVar2 != 0x10) goto LAB_0013cac1;
    pcVar18 = acStack_280;
    apcStack_308[0] = (code *)0x13c938;
    iVar2 = bson_iter_int32();
    uVar5 = extraout_XMM1_Qa_01;
    if (iVar2 != 10) goto LAB_0013cac6;
    uVar20 = 0;
    apcStack_308[0] = (code *)0x13c964;
    __n_00 = (char *)bcon_new(0,"foo",__buf,0x1d,acStack_280);
    apcStack_308[0] = (code *)0x13c96f;
    pcVar6 = (char *)bson_get_data(__n_00);
    apcStack_308[0] = (code *)0x13c97a;
    __buf = (char *)bson_get_data(__n);
    if (*(int *)(__n + 4) == *(int *)(__n_00 + 4)) {
      apcStack_308[0] = (code *)0x13c98e;
      pvVar7 = (void *)bson_get_data(__n);
      apcStack_308[0] = (code *)0x13c999;
      __s2 = (void *)bson_get_data(__n_00);
      apcStack_308[0] = (code *)0x13c9a7;
      iVar2 = bcmp(pvVar7,__s2,(ulong)*(uint *)(__n + 4));
      if (iVar2 == 0) {
        apcStack_308[0] = (code *)0x13c9b3;
        bson_destroy(__n);
        apcStack_308[0] = (code *)0x13c9bb;
        bson_destroy(__n_00);
        return;
      }
    }
    apcStack_308[0] = (code *)0x13c9d4;
    uVar14 = bson_as_canonical_extended_json(__n_00);
    apcStack_308[0] = (code *)0x13c9e1;
    pcVar8 = (char *)bson_as_canonical_extended_json(__n);
    uVar3 = *(uint *)(__n_00 + 4);
    uVar15 = 0xffffffff;
    if (uVar3 != 0) {
      uVar17 = 0;
      do {
        if (*(int *)(__n + 4) == (int)uVar17) break;
        if (pcVar6[uVar17] != __buf[uVar17]) {
          uVar15 = uVar17 & 0xffffffff;
          break;
        }
        uVar17 = uVar17 + 1;
      } while (uVar3 != (uint)uVar17);
    }
    if ((int)uVar15 == -1) {
      if (uVar3 < *(uint *)(__n + 4)) {
        uVar3 = *(uint *)(__n + 4);
      }
      uVar15 = (ulong)(uVar3 - 1);
    }
    apcStack_308[0] = (code *)0x13ca3c;
    uVar5 = extraout_XMM1_Qa_02;
    fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",uVar15);
    apcStack_308[0] = (code *)0x13ca54;
    uVar3 = open("failure.bad.bson",0x42,0x1a0);
    pcVar22 = (char *)(ulong)uVar3;
    pcVar18 = "failure.expected.bson";
    pcVar16 = (char *)0x42;
    apcStack_308[0] = (code *)0x13ca6f;
    __fd = open("failure.expected.bson",0x42,0x1a0);
    uStack_284 = uVar3;
    if (uVar3 == 0xffffffff) goto LAB_0013cacb;
    if (__fd == 0xffffffff) goto LAB_0013cad0;
    pcVar22 = (char *)(ulong)__fd;
    __n_00 = (char *)(ulong)*(uint *)(__n_00 + 4);
    pcVar18 = (char *)(ulong)uVar3;
    apcStack_308[0] = (code *)0x13ca95;
    pcVar16 = pcVar6;
    pcVar9 = (char *)write(uVar3,pcVar6,(size_t)__n_00);
    if (pcVar9 == __n_00) {
      __n = (char *)(ulong)*(uint *)(__n + 4);
      apcStack_308[0] = (code *)0x13caab;
      pcVar16 = __buf;
      pcVar18 = pcVar22;
      pcVar9 = (char *)write(__fd,__buf,(size_t)__n);
      if (pcVar9 != __n) goto LAB_0013cada;
      pcVar18 = (char *)(ulong)uStack_284;
      pcVar16 = (char *)(ulong)__fd;
      apcStack_308[0] = (code *)0x13cabc;
      test_iter_cold_6();
      goto LAB_0013cabc;
    }
  }
  apcStack_308[0] = (code *)0x13cada;
  test_iter_cold_4();
LAB_0013cada:
  apcStack_308[0] = test_extract_ctx_helper;
  test_iter_cold_5();
  puStack_6940 = auStack_6930;
  if (extraout_AL != '\0') {
    uStack_68f0 = uVar5;
  }
  puStack_6988 = (undefined8 *)0x13cb62;
  pcStack_6928 = pcVar16;
  uStack_6918 = uVar14;
  pcStack_6910 = pcVar8;
  uStack_6908 = uVar20;
  pcStack_328 = __n;
  pcStack_320 = pcVar6;
  pcStack_318 = __buf;
  pcStack_310 = __n_00;
  apcStack_308[0] = (code *)&pcStack_108;
  bcon_extract_ctx_init(aDStack_6880);
  puStack_6948 = auStack_2f8;
  uStack_6950 = 0x3000000010;
  uVar5 = 0x10;
  if (0 < (int)(uint)pcStack_6928) {
    uVar3 = (uint)pcStack_6928;
    do {
      puStack_6988 = (undefined8 *)0x13cbce;
      __s = aDStack_6880;
      pcVar6 = pcVar18;
      cVar1 = bcon_extract_ctx_va(pcVar18,aDStack_6880,&uStack_6950);
      iVar2 = (int)uVar5;
      if (cVar1 == '\0') {
        puStack_6988 = (undefined8 *)0x13cbe9;
        test_extract_ctx_helper_cold_1();
        pcStack_69b0 = (code *)0x13cc03;
        __name = __s;
        pcStack_69a8 = pcVar18;
        uStack_69a0 = (ulong)uVar3;
        pcStack_6998 = pcVar22;
        pDStack_6990 = aDStack_6880;
        puStack_6988 = &uStack_6950;
        pcVar22 = (char *)strlen(pcVar6);
        pcStack_69b0 = (code *)0x13cc0e;
        pDVar19 = __s;
        sVar10 = strlen((char *)__s);
        if ((int)sVar10 + (int)pcVar22 < 499) {
          pcStack_69b0 = (code *)0x13cc2a;
          memset(__dest,0,500);
          pcStack_69b0 = (code *)0x13cc38;
          strncat(__dest,pcVar6,(long)(int)pcVar22);
          pcStack_69b0 = (code *)0x13cc40;
          sVar11 = strlen(__dest);
          (__dest + sVar11)[0] = '/';
          (__dest + sVar11)[1] = '\0';
          pcStack_69b0 = (code *)0x13cc54;
          strncat(__dest,(char *)__s,(long)(int)sVar10);
          pcVar6 = __dest;
          do {
            if (*pcVar6 == '\\') {
              *pcVar6 = '/';
            }
            else if (*pcVar6 == '\0') {
              return;
            }
            pcVar6 = pcVar6 + 1;
          } while( true );
        }
        pcStack_69b0 = collect_tests_from_dir;
        assemble_path_cold_1();
        uVar15 = (ulong)extraout_EDX;
        pDStack_6c78 = (DIR *)0x13cc9e;
        __filename = __name;
        iStack_6c6c = iVar2;
        sStack_69d0 = sVar10;
        pcStack_69c8 = pcVar22;
        pDStack_69c0 = __s;
        pcStack_69b8 = pcVar6;
        pcStack_69b0 = (code *)apcStack_308;
        __dirp = opendir((char *)__name);
        pDVar21 = pDVar19;
        pDStack_6c80 = __s;
        if (__dirp == (DIR *)0x0) goto LAB_0013cdc9;
        pDStack_6c78 = (DIR *)0x13ccb2;
        __filename = __dirp;
        pdVar12 = readdir(__dirp);
        if (pdVar12 == (dirent *)0x0) goto LAB_0013cda8;
        pcVar22 = "..";
        pDVar21 = (DIR *)0x147699;
        pDStack_6c68 = pDVar19;
        goto LAB_0013ccd1;
      }
      uVar3 = uVar3 - 1;
    } while (uVar3 != 0);
  }
  return;
LAB_0013cd12:
  pDStack_6c78 = (DIR *)0x13cd25;
  assemble_path((char *)__name,pcVar6,acStack_6bd0);
  pDStack_6c78 = (DIR *)0x13cd32;
  iVar4 = stat(pcVar6,&sStack_6c60);
  if ((iVar4 == 0) && ((sStack_6c60.st_mode & 0xf000) == 0x4000)) {
    pDStack_6c78 = (DIR *)0x13cd60;
    uVar3 = collect_tests_from_dir((char (*) [500])pDStack_6c68,acStack_6bd0,iVar2,iStack_6c6c);
    uVar15 = (ulong)uVar3;
  }
  else {
    pDStack_6c78 = (DIR *)0x13cd73;
    pcVar8 = strstr(pcVar6,".json");
    if (pcVar8 != (char *)0x0) {
      uVar15 = (ulong)(iVar2 + 1);
      pDStack_6c78 = (DIR *)0x13cd94;
      assemble_path((char *)__name,pcVar6,(char *)(pDStack_6c68 + (long)iVar2 * 500));
    }
  }
  pDStack_6c78 = (DIR *)0x13cd9c;
  __filename = __dirp;
  pdVar12 = readdir(__dirp);
  if (pdVar12 == (dirent *)0x0) {
LAB_0013cda8:
    pDStack_6c78 = (DIR *)0x13cdb0;
    closedir(__dirp);
    return;
  }
LAB_0013ccd1:
  iVar2 = (int)uVar15;
  if (iVar2 < iStack_6c6c) {
    do {
      pcVar6 = pdVar12->d_name;
      pDStack_6c78 = (DIR *)0x13ccea;
      iVar4 = strcmp(pcVar6,"..");
      if (iVar4 != 0) {
        pDStack_6c78 = (DIR *)0x13ccf9;
        iVar4 = strcmp(pcVar6,".");
        if (iVar4 != 0) goto LAB_0013cd12;
      }
      pDStack_6c78 = (DIR *)0x13cd05;
      pdVar12 = readdir(__dirp);
      if (pdVar12 == (dirent *)0x0) goto LAB_0013cda8;
    } while( true );
  }
  pDStack_6c78 = (DIR *)0x13cdc9;
  collect_tests_from_dir_cold_1();
  pDStack_6c80 = __dirp;
LAB_0013cdc9:
  pDStack_6c78 = (DIR *)get_bson_from_json_file;
  collect_tests_from_dir_cold_2();
  uStack_6c98 = uVar15;
  pDStack_6c90 = pDVar21;
  pcStack_6c88 = pcVar22;
  pDStack_6c78 = __name;
  __stream = fopen((char *)__filename,"rb");
  if (__stream != (FILE *)0x0) {
    fseek(__stream,0,2);
    sVar10 = ftell(__stream);
    fseek(__stream,0,0);
    if (0 < (long)sVar10) {
      pvVar7 = (void *)bson_malloc0(sVar10);
      sVar11 = fread(pvVar7,1,sVar10,__stream);
      if (sVar11 != sVar10) {
        abort();
      }
      fclose(__stream);
      if (pvVar7 != (void *)0x0) {
        lVar13 = bson_new_from_json(pvVar7,sVar10,auStack_6e98);
        if (lVar13 == 0) {
          fprintf(_stderr,"Cannot parse %s: %s\n",__filename,auStack_6e90);
          abort();
        }
        bson_free(pvVar7);
      }
    }
  }
  return;
}

Assistant:

static void
test_inline_doc (void)
{
   int32_t a, b;

   bson_t *bcon =
      BCON_NEW ("foo", "{", "b", BCON_INT32 (2), "a", BCON_INT32 (1), "}");

   BSON_ASSERT (BCON_EXTRACT (
      bcon, "foo", "{", "a", BCONE_INT32 (a), "b", BCONE_INT32 (b), "}"));

   BSON_ASSERT (a == 1);
   BSON_ASSERT (b == 2);

   bson_destroy (bcon);
}